

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetMaskFrameType(ON_DimStyle *this,MaskFrame source)

{
  undefined8 uVar1;
  uchar uVar2;
  ON_Color OVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined8 uVar12;
  ON_TextMask text_mask;
  ON_TextMask local_38;
  undefined4 uVar6;
  undefined3 uVar8;
  undefined2 uVar10;
  
  local_38.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  local_38.m_mask_type = (this->m_text_mask).m_mask_type;
  local_38.m_mask_frame = (this->m_text_mask).m_mask_frame;
  uVar2 = (this->m_text_mask).m_reserved2;
  OVar3.field_0 = (this->m_text_mask).m_mask_color.field_0;
  local_38._3_5_ = CONCAT41(OVar3.field_0,uVar2);
  local_38.m_mask_border = (this->m_text_mask).m_mask_border;
  uVar4 = (this->m_text_mask).m_reserved3;
  uVar5 = (this->m_text_mask).m_content_hash.m_digest[0];
  uVar7 = (this->m_text_mask).m_content_hash.m_digest[1];
  uVar9 = (this->m_text_mask).m_content_hash.m_digest[2];
  uVar11 = (this->m_text_mask).m_content_hash.m_digest[3];
  uVar10 = CONCAT11(uVar11,uVar9);
  uVar8 = CONCAT21(uVar10,uVar7);
  uVar6 = CONCAT31(uVar8,uVar5);
  uVar12 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  local_38.m_content_hash.m_digest._12_4_ = SUB84(uVar1,0);
  local_38.m_content_hash.m_digest._16_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  local_38.m_content_hash.m_digest._4_4_ = SUB84(uVar12,0);
  local_38.m_content_hash.m_digest._8_4_ = SUB84((ulong)uVar12 >> 0x20,0);
  local_38.m_content_hash.m_digest._0_4_ = uVar6;
  if (local_38.m_mask_frame != source) {
    local_38.m_mask_frame = source;
    local_38.m_content_hash.m_digest._0_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
    local_38.m_content_hash.m_digest._4_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
    local_38.m_content_hash.m_digest._8_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
    local_38.m_content_hash.m_digest._12_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
    local_38.m_content_hash.m_digest._16_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  }
  local_38.m_reserved3 = uVar4;
  Internal_SetTextMask(this,&local_38);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskFrameType);
  return;
}

Assistant:

void ON_DimStyle::SetMaskFrameType(ON_TextMask::MaskFrame source)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskFrameType(source);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskFrameType);
}